

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

char * JS_ToCStringLen2(JSContext *ctx,size_t *plen,JSValue val1,BOOL cesu8)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  JSValueUnion in_RAX;
  JSString *pJVar5;
  JSString *pJVar6;
  ulong uVar7;
  int64_t iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  JSString *pJVar12;
  uint uVar13;
  JSValue JVar14;
  JSValueUnion local_50;
  
  iVar8 = val1.tag;
  local_50 = val1.u;
  if ((int)val1.tag == -7) {
    *(int *)local_50.ptr = *local_50.ptr + 1;
LAB_0011b320:
    pJVar5 = *(JSString **)((long)local_50.ptr + 4);
    uVar11 = (uint)pJVar5;
    uVar7 = (ulong)pJVar5 & 0x7fffffff;
    uVar3 = (ulong)pJVar5 & 0x7fffffff;
    uVar13 = uVar11 & 0x7fffffff;
    pJVar12 = (JSString *)((long)local_50.ptr + 0x10);
    if ((int)uVar11 < 0) {
      pJVar5 = js_alloc_string(ctx,uVar13 * 3,0);
      if (pJVar5 == (JSString *)0x0) {
        in_RAX.float64 = 0.0;
      }
      else {
        in_RAX.ptr = pJVar5 + 1;
        if (uVar7 != 0) {
          iVar10 = 0;
          do {
            iVar9 = iVar10 + 1;
            uVar2 = *(ushort *)((long)&(pJVar12->header).ref_count + (long)iVar10 * 2);
            uVar11 = (uint)uVar2;
            if (uVar2 < 0x80) {
              *(byte *)in_RAX.ptr = (byte)uVar2;
              in_RAX.float64 = in_RAX.float64 + 1;
            }
            else {
              if (((((uVar2 & 0xfc00) == 0xd800) && (cesu8 == 0)) && (iVar9 < (int)uVar13)) &&
                 (uVar4 = (uint)*(ushort *)((long)&(pJVar12->header).ref_count + (long)iVar9 * 2),
                 (uVar4 & 0xfc00) == 0xdc00)) {
                iVar9 = iVar10 + 2;
                uVar11 = (uVar2 & 0x3ff) * 0x400 + (uVar4 & 0x3ff) + 0x10000;
              }
              iVar10 = unicode_to_utf8((uint8_t *)in_RAX.ptr,uVar11);
              in_RAX.float64 = (long)iVar10 + in_RAX.float64;
            }
            iVar10 = iVar9;
          } while (iVar9 < (int)uVar13);
        }
      }
      if (pJVar5 == (JSString *)0x0) goto LAB_0011b391;
    }
    else {
      if (((ulong)pJVar5 & 0x7fffffff) == 0) {
        iVar10 = 0;
      }
      else {
        in_RAX._0_4_ = uVar11 & 0x7fffffff;
        in_RAX._4_4_ = 0;
        pJVar6 = (JSString *)0x0;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + (uint)(*(byte *)((long)&(pJVar12->header).ref_count +
                                            (long)&(pJVar6->header).ref_count) >> 7);
          pJVar6 = (JSString *)((long)&(pJVar6->header).ref_count + 1);
        } while ((JSString *)in_RAX.ptr != pJVar6);
      }
      if (iVar10 == 0) {
        iVar10 = 1;
        if (plen != (size_t *)0x0) {
          pJVar5 = (JSString *)(ulong)(uVar11 & 0x7fffffff);
          *plen = (size_t)pJVar5;
        }
      }
      else {
        pJVar5 = js_alloc_string(ctx,iVar10 + uVar13,0);
        if (pJVar5 == (JSString *)0x0) {
          iVar10 = 2;
          pJVar5 = (JSString *)0x0;
          in_RAX.float64 = 0.0;
        }
        else {
          in_RAX.ptr = pJVar5 + 1;
          if (uVar3 != 0) {
            uVar7 = 0;
            do {
              bVar1 = *(byte *)((long)&(pJVar12->header).ref_count + uVar7);
              if ((char)bVar1 < '\0') {
                *(byte *)in_RAX.ptr = bVar1 >> 6 | 0xc0;
                *(byte *)((long)in_RAX.ptr + 1) = bVar1 & 0xbf;
                in_RAX.float64 = in_RAX.float64 + 2;
              }
              else {
                *(byte *)in_RAX.ptr = bVar1;
                in_RAX.float64 = in_RAX.float64 + 1;
              }
              uVar7 = uVar7 + 1;
            } while ((uVar11 & 0x7fffffff) != uVar7);
          }
          iVar10 = 0;
        }
      }
      if (iVar10 != 0) {
        if (iVar10 != 2) {
          return (char *)pJVar12;
        }
        goto LAB_0011b391;
      }
    }
    *(byte *)in_RAX.ptr = 0;
    pJVar12 = pJVar5 + 1;
    *(ulong *)&pJVar5->field_0x4 =
         *(ulong *)&pJVar5->field_0x4 & 0xffffffff80000000 |
         (ulong)(in_RAX.int32 - (int)pJVar12 & 0x7fffffff);
    if ((0xfffffff4 < (uint)iVar8) &&
       (iVar10 = *local_50.ptr, *(int *)local_50.ptr = iVar10 + -1, iVar10 < 2)) {
      JVar14.tag = iVar8;
      JVar14.u.ptr = local_50.ptr;
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
    if (plen == (size_t *)0x0) {
      return (char *)pJVar12;
    }
    uVar7 = (ulong)((uint)*(undefined8 *)&pJVar5->field_0x4 & 0x7fffffff);
  }
  else {
    JVar14 = JS_ToStringInternal(ctx,val1,0);
    iVar8 = JVar14.tag;
    in_RAX = JVar14.u;
    local_50 = in_RAX;
    if ((int)JVar14.tag != 6) goto LAB_0011b320;
LAB_0011b391:
    uVar7 = 0;
    pJVar12 = (JSString *)0x0;
    if (plen == (size_t *)0x0) {
      return (char *)0x0;
    }
  }
  *plen = uVar7;
  return (char *)pJVar12;
}

Assistant:

const char *JS_ToCStringLen2(JSContext *ctx, size_t *plen, JSValueConst val1, BOOL cesu8)
{
    JSValue val;
    JSString *str, *str_new;
    int pos, len, c, c1;
    uint8_t *q;

    if (JS_VALUE_GET_TAG(val1) != JS_TAG_STRING) {
        val = JS_ToString(ctx, val1);
        if (JS_IsException(val))
            goto fail;
    } else {
        val = JS_DupValue(ctx, val1);
    }

    str = JS_VALUE_GET_STRING(val);
    len = str->len;
    if (!str->is_wide_char) {
        const uint8_t *src = str->u.str8;
        int count;

        /* count the number of non-ASCII characters */
        /* Scanning the whole string is required for ASCII strings,
           and computing the number of non-ASCII bytes is less expensive
           than testing each byte, hence this method is faster for ASCII
           strings, which is the most common case.
         */
        count = 0;
        for (pos = 0; pos < len; pos++) {
            count += src[pos] >> 7;
        }
        if (count == 0) {
            if (plen)
                *plen = len;
            return (const char *)src;
        }
        str_new = js_alloc_string(ctx, len + count, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        for (pos = 0; pos < len; pos++) {
            c = src[pos];
            if (c < 0x80) {
                *q++ = c;
            } else {
                *q++ = (c >> 6) | 0xc0;
                *q++ = (c & 0x3f) | 0x80;
            }
        }
    } else {
        const uint16_t *src = str->u.str16;
        /* Allocate 3 bytes per 16 bit code point. Surrogate pairs may
           produce 4 bytes but use 2 code points.
         */
        str_new = js_alloc_string(ctx, len * 3, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        pos = 0;
        while (pos < len) {
            c = src[pos++];
            if (c < 0x80) {
                *q++ = c;
            } else {
                if (c >= 0xd800 && c < 0xdc00) {
                    if (pos < len && !cesu8) {
                        c1 = src[pos];
                        if (c1 >= 0xdc00 && c1 < 0xe000) {
                            pos++;
                            /* surrogate pair */
                            c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
                        } else {
                            /* Keep unmatched surrogate code points */
                            /* c = 0xfffd; */ /* error */
                        }
                    } else {
                        /* Keep unmatched surrogate code points */
                        /* c = 0xfffd; */ /* error */
                    }
                }
                q += unicode_to_utf8(q, c);
            }
        }
    }

    *q = '\0';
    str_new->len = q - str_new->u.str8;
    JS_FreeValue(ctx, val);
    if (plen)
        *plen = str_new->len;
    return (const char *)str_new->u.str8;
 fail:
    if (plen)
        *plen = 0;
    return NULL;
}